

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_1::PushConstantComputeTest::initPrograms
          (PushConstantComputeTest *this,SourceCollections *sourceCollections)

{
  ostream *poVar1;
  ProgramSources *this_00;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream computeSrc;
  SourceCollections *sourceCollections_local;
  PushConstantComputeTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"#version 450\n");
  poVar1 = std::operator<<(poVar1,
                           "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar1 = std::operator<<(poVar1,"layout(std140, set = 0, binding = 0) writeonly buffer Output {\n"
                          );
  poVar1 = std::operator<<(poVar1,"  vec4 elements[];\n");
  poVar1 = std::operator<<(poVar1,"} outData;\n");
  poVar1 = std::operator<<(poVar1,"layout(push_constant) uniform Material{\n");
  poVar1 = std::operator<<(poVar1,"  vec4 element;\n");
  poVar1 = std::operator<<(poVar1,"} matInst;\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"  outData.elements[gl_GlobalInvocationID.x] = matInst.element;\n"
                          );
  std::operator<<(poVar1,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"compute",&local_1c1);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(this_00,&local_1f0);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void PushConstantComputeTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream	computeSrc;

	computeSrc << "#version 450\n"
			   << "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
			   << "layout(std140, set = 0, binding = 0) writeonly buffer Output {\n"
			   << "  vec4 elements[];\n"
			   << "} outData;\n"
			   << "layout(push_constant) uniform Material{\n"
			   << "  vec4 element;\n"
			   << "} matInst;\n"
			   << "void main (void)\n"
			   << "{\n"
			   << "  outData.elements[gl_GlobalInvocationID.x] = matInst.element;\n"
			   << "}\n";

	sourceCollections.glslSources.add("compute") << glu::ComputeSource(computeSrc.str());
}